

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

bool __thiscall crnlib::dynamic_string::set_len(dynamic_string *this,uint new_len,char fill_char)

{
  bool bVar1;
  uint uVar2;
  uint cur_len;
  char fill_char_local;
  uint new_len_local;
  dynamic_string *this_local;
  
  if ((new_len < 0xffff) && (fill_char != '\0')) {
    uVar2 = (uint)this->m_len;
    bVar1 = ensure_buf(this,new_len,true);
    if (bVar1) {
      if (uVar2 < new_len) {
        memset(this->m_pStr + uVar2,(uint)(byte)fill_char,(ulong)(new_len - uVar2));
      }
      this->m_pStr[new_len] = '\0';
      this->m_len = (uint16)new_len;
      check(this);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool dynamic_string::set_len(uint new_len, char fill_char)
    {
        if ((new_len >= cUINT16_MAX) || (!fill_char))
        {
            CRNLIB_ASSERT(0);
            return false;
        }

        uint cur_len = m_len;

        if (ensure_buf(new_len, true))
        {
            if (new_len > cur_len)
            {
                memset(m_pStr + cur_len, fill_char, new_len - cur_len);
            }

            m_pStr[new_len] = 0;

            m_len = static_cast<uint16>(new_len);

            check();
        }

        return true;
    }